

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion * __thiscall QRegion::operator^=(QRegion *this,QRegion *r)

{
  QRegion *pQVar1;
  QRegion *in_RDI;
  long in_FS_OFFSET;
  QRegion *r_00;
  QRegion *in_stack_ffffffffffffffd8;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r_00 = &local_10;
  operator^(in_stack_ffffffffffffffd8,r_00);
  pQVar1 = operator=(r_00,in_RDI);
  ~QRegion(r_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRegion& QRegion::operator^=(const QRegion &r)
    { return *this = *this ^ r; }